

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

int read_delta_lflevel(AV1_COMMON *cm,aom_reader *r,aom_cdf_prob *cdf,MB_MODE_INFO *mbmi,int mi_col,
                      int mi_row)

{
  od_ec_dec *dec;
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  undefined4 in_register_00000084;
  uint uVar9;
  int literal;
  uint uVar10;
  uint uVar11;
  uint in_stack_00000008;
  
  uVar9 = (mi_row | in_stack_00000008) & (int)r - 1U;
  if (*(char *)CONCAT44(in_register_00000084,mi_col) == (char)cm) {
    if (((char *)CONCAT44(in_register_00000084,mi_col))[0x90] != '\0' || uVar9 != 0) {
      return 0;
    }
  }
  else if (uVar9 != 0) {
    return 0;
  }
  dec = (od_ec_dec *)(cdf + 8);
  iVar4 = od_ec_decode_cdf_q15(dec,(uint16_t *)mbmi,4);
  if ((char)cdf[0x1c] != '\0') {
    uVar1 = mbmi->mv[0].as_mv.row;
    bVar6 = (char)(uVar1 >> 4) + 5;
    lVar8 = 0;
    do {
      uVar2 = *(ushort *)((long)mbmi->mv + lVar8 * 2 + -8);
      if (lVar8 < (char)iVar4) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar6 & 0x1f));
      }
      *(ushort *)((long)mbmi->mv + lVar8 * 2 + -8) = sVar3 + uVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    mbmi->mv[0].as_mv.row = mbmi->mv[0].as_mv.row + (ushort)(uVar1 < 0x20);
  }
  if (2 < iVar4) {
    uVar10 = 0;
    uVar9 = 4;
    do {
      iVar4 = od_ec_decode_bool_q15(dec,0x4000);
      uVar10 = uVar10 | iVar4 << ((char)uVar9 - 2U & 0x1f);
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
    uVar7 = 0;
    uVar9 = uVar10;
    if (-1 < (int)uVar10) {
      do {
        iVar4 = od_ec_decode_bool_q15(dec,0x4000);
        uVar7 = uVar7 | iVar4 << ((byte)uVar9 & 0x1f);
        uVar11 = uVar9 + 1;
        uVar9 = uVar9 - 1;
      } while (1 < uVar11);
    }
    iVar4 = (1 << ((char)uVar10 + 1U & 0x1f)) + 1 + uVar7;
  }
  if (iVar4 == 0) {
    return 0;
  }
  iVar5 = od_ec_decode_bool_q15(dec,0x4000);
  if (iVar5 == 0) {
    return iVar4;
  }
  return -iVar4;
}

Assistant:

static int read_delta_lflevel(const AV1_COMMON *const cm, aom_reader *r,
                              aom_cdf_prob *const cdf,
                              const MB_MODE_INFO *const mbmi, int mi_col,
                              int mi_row) {
  int reduced_delta_lflevel = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int b_col = mi_col & (cm->seq_params->mib_size - 1);
  const int b_row = mi_row & (cm->seq_params->mib_size - 1);
  const int read_delta_lf_flag = (b_col == 0 && b_row == 0);

  if ((bsize != cm->seq_params->sb_size || mbmi->skip_txfm == 0) &&
      read_delta_lf_flag) {
    int abs = aom_read_symbol(r, cdf, DELTA_LF_PROBS + 1, ACCT_STR);
    const int smallval = (abs < DELTA_LF_SMALL);
    if (!smallval) {
      const int rem_bits = aom_read_literal(r, 3, ACCT_STR) + 1;
      const int thr = (1 << rem_bits) + 1;
      abs = aom_read_literal(r, rem_bits, ACCT_STR) + thr;
    }
    const int sign = abs ? aom_read_bit(r, ACCT_STR) : 1;
    reduced_delta_lflevel = sign ? -abs : abs;
  }
  return reduced_delta_lflevel;
}